

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_tile_info_max_tile(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int cm_mi_cols;
  int iVar4;
  SequenceHeader *seq_params_00;
  CommonTileParams *in_RSI;
  long in_RDI;
  int size_sb_1;
  int start_sb_1;
  int i_1;
  int size_sb;
  int start_sb;
  int i;
  int height_sb;
  int width_sb;
  CommonTileParams *tiles;
  SequenceHeader *seq_params;
  undefined8 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  CommonTileParams *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_RDI + 0x6088);
  seq_params_00 = (SequenceHeader *)(in_RDI + 0x60a0);
  iVar3 = *(int *)(in_RDI + 0x218) + (1 << ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f)) + -1 >>
          ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f);
  cm_mi_cols = *(int *)(in_RDI + 0x214) + (1 << ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f)) + -1
               >> ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f);
  av1_get_tile_limits((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  seq_params_00->frame_id_length = iVar4;
  if (seq_params_00->frame_id_length == 0) {
    in_stack_ffffffffffffffd4 = 0;
    in_stack_ffffffffffffffd0 = 0;
    while( true ) {
      uVar2 = in_stack_ffffffffffffffbc & 0xffffff;
      if (0 < iVar3) {
        uVar2 = CONCAT13(in_stack_ffffffffffffffd4 < 0x40,(int3)in_stack_ffffffffffffffbc);
      }
      in_stack_ffffffffffffffbc = uVar2;
      if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
      in_stack_ffffffffffffffac = iVar3;
      if (seq_params_00->max_frame_width <= iVar3) {
        in_stack_ffffffffffffffac = seq_params_00->max_frame_width;
      }
      in_stack_ffffffffffffffb0 = in_RSI;
      iVar4 = rb_read_uniform((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      seq_params_00->operating_point_idc[(long)in_stack_ffffffffffffffd4 + -0xe] =
           in_stack_ffffffffffffffd0;
      in_stack_ffffffffffffffd0 = iVar4 + 1 + in_stack_ffffffffffffffd0;
      iVar3 = iVar3 - (iVar4 + 1);
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
    }
    seq_params_00->num_bits_width = in_stack_ffffffffffffffd4;
    seq_params_00->operating_point_idc[(long)in_stack_ffffffffffffffd4 + -0xe] =
         in_stack_ffffffffffffffd0 + iVar3;
  }
  else {
    seq_params_00->delta_frame_id_length = (seq_params_00->order_hint_info).enable_order_hint;
    while ((seq_params_00->delta_frame_id_length <
            (seq_params_00->order_hint_info).enable_dist_wtd_comp &&
           (iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
           iVar4 != 0))) {
      seq_params_00->delta_frame_id_length = seq_params_00->delta_frame_id_length + 1;
    }
  }
  av1_calculate_tile_cols
            (seq_params_00,iVar3,cm_mi_cols,
             (CommonTileParams *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (seq_params_00->frame_id_length == 0) {
    local_38 = 0;
    in_stack_ffffffffffffffc4 = 0;
    while( true ) {
      uVar2 = in_stack_ffffffffffffffa8 & 0xffffff;
      if (0 < cm_mi_cols) {
        uVar2 = CONCAT13(local_38 < 0x40,(int3)in_stack_ffffffffffffffa8);
      }
      in_stack_ffffffffffffffa8 = uVar2;
      if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') break;
      iVar3 = rb_read_uniform((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (int)((ulong)in_RSI >> 0x20));
      in_stack_ffffffffffffffc0 = iVar3 + 1;
      *(int *)(seq_params_00->tier + (long)local_38 * 4 + -1) = in_stack_ffffffffffffffc4;
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc0 + in_stack_ffffffffffffffc4;
      cm_mi_cols = cm_mi_cols - in_stack_ffffffffffffffc0;
      local_38 = local_38 + 1;
    }
    seq_params_00->num_bits_height = local_38;
    *(int *)(seq_params_00->tier + (long)local_38 * 4 + -1) = in_stack_ffffffffffffffc4 + cm_mi_cols
    ;
  }
  else {
    *(int *)&seq_params_00->sb_size = (seq_params_00->order_hint_info).order_hint_bits_minus_1;
    while ((*(int *)&seq_params_00->sb_size < (seq_params_00->order_hint_info).enable_ref_frame_mvs
           && (iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)
                                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                                      ), iVar3 != 0))) {
      *(int *)&seq_params_00->sb_size = *(int *)&seq_params_00->sb_size + 1;
    }
  }
  av1_calculate_tile_rows
            ((SequenceHeader *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static inline void read_tile_info_max_tile(
    AV1_COMMON *const cm, struct aom_read_bit_buffer *const rb) {
  const SequenceHeader *const seq_params = cm->seq_params;
  CommonTileParams *const tiles = &cm->tiles;
  int width_sb =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, seq_params->mib_size_log2);
  int height_sb =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, seq_params->mib_size_log2);

  av1_get_tile_limits(cm);
  tiles->uniform_spacing = aom_rb_read_bit(rb);

  // Read tile columns
  if (tiles->uniform_spacing) {
    tiles->log2_cols = tiles->min_log2_cols;
    while (tiles->log2_cols < tiles->max_log2_cols) {
      if (!aom_rb_read_bit(rb)) {
        break;
      }
      tiles->log2_cols++;
    }
  } else {
    int i;
    int start_sb;
    for (i = 0, start_sb = 0; width_sb > 0 && i < MAX_TILE_COLS; i++) {
      const int size_sb =
          1 + rb_read_uniform(rb, AOMMIN(width_sb, tiles->max_width_sb));
      tiles->col_start_sb[i] = start_sb;
      start_sb += size_sb;
      width_sb -= size_sb;
    }
    tiles->cols = i;
    tiles->col_start_sb[i] = start_sb + width_sb;
  }
  av1_calculate_tile_cols(seq_params, cm->mi_params.mi_rows,
                          cm->mi_params.mi_cols, tiles);

  // Read tile rows
  if (tiles->uniform_spacing) {
    tiles->log2_rows = tiles->min_log2_rows;
    while (tiles->log2_rows < tiles->max_log2_rows) {
      if (!aom_rb_read_bit(rb)) {
        break;
      }
      tiles->log2_rows++;
    }
  } else {
    int i;
    int start_sb;
    for (i = 0, start_sb = 0; height_sb > 0 && i < MAX_TILE_ROWS; i++) {
      const int size_sb =
          1 + rb_read_uniform(rb, AOMMIN(height_sb, tiles->max_height_sb));
      tiles->row_start_sb[i] = start_sb;
      start_sb += size_sb;
      height_sb -= size_sb;
    }
    tiles->rows = i;
    tiles->row_start_sb[i] = start_sb + height_sb;
  }
  av1_calculate_tile_rows(seq_params, cm->mi_params.mi_rows, tiles);
}